

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O2

bool s_eqi(string *s1,string *s2)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  char cVar11;
  bool bVar12;
  
  uVar9 = (uint)s1->_M_string_length;
  uVar6 = (uint)s2->_M_string_length;
  uVar3 = uVar6;
  if ((int)uVar9 < (int)uVar6) {
    uVar3 = uVar9;
  }
  uVar10 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar10;
  }
  while (uVar4 != uVar10) {
    cVar2 = (s1->_M_dataplus)._M_p[uVar10];
    cVar11 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar11 = cVar2;
    }
    cVar2 = (s2->_M_dataplus)._M_p[uVar10];
    cVar8 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar8 = cVar2;
    }
    uVar10 = uVar10 + 1;
    if (cVar11 != cVar8) {
      return false;
    }
  }
  iVar5 = uVar9 - uVar6;
  if (iVar5 != 0 && (int)uVar6 <= (int)uVar9) {
    lVar7 = (long)(int)uVar6;
    do {
      bVar12 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar12) {
        return bVar12;
      }
      pcVar1 = (s1->_M_dataplus)._M_p + lVar7;
      lVar7 = lVar7 + 1;
    } while (*pcVar1 == ' ');
    return bVar12;
  }
  if ((int)uVar9 < (int)uVar6) {
    lVar7 = (long)(int)uVar9;
    do {
      bVar12 = (int)uVar6 == lVar7;
      if (bVar12) {
        return bVar12;
      }
      pcVar1 = (s2->_M_dataplus)._M_p + lVar7;
      lVar7 = lVar7 + 1;
    } while (*pcVar1 == ' ');
    return bVar12;
  }
  return true;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}